

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort.cpp
# Opt level: O3

void merge_4way(uchar **from0,size_t n0,uchar **from1,size_t n1,uchar **from2,size_t n2,
               uchar **from3,size_t n3,uchar **result)

{
  int iVar1;
  uchar *puVar2;
  uchar **ppuVar3;
  uchar **ppuVar4;
  uchar *puVar5;
  uchar *puVar6;
  char *pcVar7;
  uchar *__s1;
  long lVar8;
  uchar **local_70;
  uchar **local_68;
  uchar **local_60;
  uchar **local_58;
  uchar **local_50;
  size_t local_48;
  size_t local_40;
  size_t local_38;
  
  puVar5 = *from0;
  if (puVar5 == (uchar *)0x0) goto LAB_001bfe0e;
  puVar6 = *from1;
  if (puVar6 != (uchar *)0x0) {
    local_70 = result;
    local_48 = n3;
    local_60 = from3;
    iVar1 = strcmp((char *)puVar5,(char *)puVar6);
    puVar2 = *from2;
    local_68 = from2;
    local_40 = n0;
    local_58 = from0;
    ppuVar3 = (uchar **)n2;
    local_50 = from1;
    local_38 = n1;
    if (iVar1 < 1) {
      if (puVar2 != (uchar *)0x0) {
        iVar1 = strcmp((char *)puVar6,(char *)puVar2);
        if (iVar1 < 1) {
          __s1 = *from3;
          if (__s1 != (uchar *)0x0) {
            iVar1 = strcmp((char *)__s1,(char *)puVar5);
            if (-1 < iVar1) {
              iVar1 = strcmp((char *)__s1,(char *)puVar6);
              if (iVar1 < 0) goto LAB_001be2b5;
              iVar1 = strcmp((char *)__s1,(char *)puVar2);
              if (iVar1 < 0) goto LAB_001bec74;
              goto LAB_001bed9f;
            }
LAB_001bdf67:
            lVar8 = 0;
            do {
              iVar1 = strcmp((char *)__s1,(char *)puVar5);
              if (0 < iVar1) {
LAB_001bfb40:
                pcVar7 = "cmp(*from3, *from0) <= 0";
LAB_001bfb59:
                __assert_fail(pcVar7,
                              "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                              ,0x1b4,
                              "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                             );
              }
              puVar6 = *local_50;
              if (puVar6 == (uchar *)0x0) goto LAB_001bfdef;
              iVar1 = strcmp((char *)puVar5,(char *)puVar6);
              if (0 < iVar1) {
                pcVar7 = "cmp(*from0, *from1) <= 0";
                goto LAB_001bfb59;
              }
              if (*from2 == (uchar *)0x0) goto LAB_001bfdef;
              iVar1 = strcmp((char *)puVar6,(char *)*from2);
              if (0 < iVar1) {
                pcVar7 = "cmp(*from1, *from2) <= 0";
                goto LAB_001bfb59;
              }
              *(uchar **)((long)local_70 + lVar8) = __s1;
              ppuVar3 = from2;
              local_68 = (uchar **)n2;
              if (local_48 == 1) goto LAB_001bf97e;
              __s1 = *(uchar **)((long)local_60 + lVar8 + 8);
              if (__s1 == (uchar *)0x0) goto LAB_001bfe0e;
              puVar5 = *local_58;
              if (puVar5 == (uchar *)0x0) goto LAB_001bfdef;
              iVar1 = strcmp((char *)__s1,(char *)puVar5);
              lVar8 = lVar8 + 8;
              local_48 = local_48 - 1;
            } while (iVar1 < 0);
            puVar6 = *local_50;
            if (puVar6 == (uchar *)0x0) goto LAB_001bfdef;
            local_60 = (uchar **)((long)local_60 + lVar8);
            local_70 = (uchar **)((long)local_70 + lVar8);
            iVar1 = strcmp((char *)__s1,(char *)puVar6);
            local_68 = from2;
            ppuVar3 = (uchar **)n2;
            if (iVar1 < 0) {
LAB_001be2b5:
              lVar8 = 0;
              do {
                iVar1 = strcmp((char *)puVar5,(char *)__s1);
                if (0 < iVar1) goto LAB_001bf510;
                puVar6 = *local_50;
                if (puVar6 == (uchar *)0x0) goto LAB_001bfdef;
                iVar1 = strcmp((char *)__s1,(char *)puVar6);
                if (0 < iVar1) goto LAB_001bec50;
                if (*local_68 == (uchar *)0x0) goto LAB_001bfdef;
                iVar1 = strcmp((char *)puVar6,(char *)*local_68);
                if (0 < iVar1) {
                  pcVar7 = "cmp(*from1, *from2) <= 0";
                  goto LAB_001bf4f8;
                }
                *(uchar **)((long)local_70 + lVar8) = puVar5;
                from2 = local_68;
                ppuVar4 = local_50;
                if (local_40 == 1) goto LAB_001bed56;
                puVar5 = *(uchar **)((long)local_58 + lVar8 + 8);
                if (puVar5 == (uchar *)0x0) goto LAB_001bfe0e;
                __s1 = *local_60;
                if (__s1 == (uchar *)0x0) goto LAB_001bfdef;
                iVar1 = strcmp((char *)puVar5,(char *)__s1);
                lVar8 = lVar8 + 8;
                local_40 = local_40 - 1;
              } while (iVar1 < 1);
              puVar6 = *local_50;
              if (puVar6 == (uchar *)0x0) goto LAB_001bfdef;
              local_58 = (uchar **)((long)local_58 + lVar8);
              local_70 = (uchar **)((long)local_70 + lVar8);
              iVar1 = strcmp((char *)puVar5,(char *)puVar6);
              n2 = (size_t)ppuVar3;
              if (0 < iVar1) {
                if (*local_68 != (uchar *)0x0) {
                  iVar1 = strcmp((char *)puVar5,(char *)*local_68);
                  if (iVar1 < 1) goto LAB_001bf894;
LAB_001be7ed:
                  lVar8 = 0;
                  do {
                    iVar1 = strcmp((char *)__s1,(char *)puVar6);
                    if (0 < iVar1) {
                      pcVar7 = "cmp(*from3, *from1) <= 0";
                      goto LAB_001bf64b;
                    }
                    puVar5 = *local_68;
                    if (puVar5 == (uchar *)0x0) goto LAB_001bfdef;
                    iVar1 = strcmp((char *)puVar6,(char *)puVar5);
                    if (0 < iVar1) {
                      pcVar7 = "cmp(*from1, *from2) <= 0";
                      goto LAB_001bf64b;
                    }
                    if (*local_58 == (uchar *)0x0) goto LAB_001bfdef;
                    iVar1 = strcmp((char *)puVar5,(char *)*local_58);
                    if (0 < iVar1) goto LAB_001bfe39;
                    *(uchar **)((long)local_70 + lVar8) = __s1;
                    if (local_48 == 1) {
                      local_70 = (uchar **)((long)local_70 + lVar8 + 8);
                      n2 = local_38;
                      from2 = local_50;
                      local_60 = local_68;
                      goto LAB_001bfd97;
                    }
                    __s1 = *(uchar **)((long)local_60 + lVar8 + 8);
                    if (__s1 == (uchar *)0x0) goto LAB_001bfe0e;
                    puVar6 = *local_50;
                    if (puVar6 == (uchar *)0x0) goto LAB_001bfdef;
                    iVar1 = strcmp((char *)__s1,(char *)puVar6);
                    lVar8 = lVar8 + 8;
                    local_48 = local_48 - 1;
                  } while (iVar1 < 0);
                  puVar2 = *local_68;
                  if (puVar2 != (uchar *)0x0) {
                    local_60 = (uchar **)((long)local_60 + lVar8);
                    local_70 = (uchar **)((long)local_70 + lVar8);
                    iVar1 = strcmp((char *)__s1,(char *)puVar2);
                    from2 = local_68;
                    n2 = (size_t)ppuVar3;
                    if (iVar1 < 0) goto LAB_001bf254;
                    puVar5 = *local_58;
                    if (puVar5 != (uchar *)0x0) {
LAB_001be8d8:
                      iVar1 = strcmp((char *)__s1,(char *)puVar5);
                      if (iVar1 < 0) goto LAB_001beece;
LAB_001be910:
                      lVar8 = 0;
                      do {
                        iVar1 = strcmp((char *)puVar6,(char *)puVar2);
                        if (0 < iVar1) {
                          pcVar7 = "cmp(*from1, *from2) <= 0";
                          goto LAB_001bf78b;
                        }
                        puVar5 = *local_58;
                        if (puVar5 == (uchar *)0x0) goto LAB_001bfdef;
                        iVar1 = strcmp((char *)puVar2,(char *)puVar5);
                        if (0 < iVar1) {
                          pcVar7 = "cmp(*from2, *from0) <= 0";
                          goto LAB_001bf78b;
                        }
                        if (*local_60 == (uchar *)0x0) goto LAB_001bfdef;
                        iVar1 = strcmp((char *)puVar5,(char *)*local_60);
                        if (0 < iVar1) goto LAB_001bea0d;
                        *(uchar **)((long)local_70 + lVar8) = puVar6;
                        from2 = local_68;
                        if (local_38 == 1) goto LAB_001bf761;
                        puVar6 = *(uchar **)((long)local_50 + lVar8 + 8);
                        if (puVar6 == (uchar *)0x0) goto LAB_001bfe0e;
                        puVar2 = *local_68;
                        if (puVar2 == (uchar *)0x0) goto LAB_001bfdef;
                        iVar1 = strcmp((char *)puVar6,(char *)puVar2);
                        lVar8 = lVar8 + 8;
                        local_38 = local_38 - 1;
                      } while (iVar1 < 1);
                      puVar5 = *local_58;
                      if (puVar5 != (uchar *)0x0) {
                        local_50 = (uchar **)((long)local_50 + lVar8);
                        local_70 = (uchar **)((long)local_70 + lVar8);
                        iVar1 = strcmp((char *)puVar6,(char *)puVar5);
                        if (iVar1 < 0) goto LAB_001be5b5;
                        if (*local_60 != (uchar *)0x0) {
                          iVar1 = strcmp((char *)puVar6,(char *)*local_60);
                          if (iVar1 < 1) goto LAB_001bf3a9;
LAB_001bea31:
                          do {
                            lVar8 = 0;
                            do {
                              iVar1 = strcmp((char *)puVar2,(char *)puVar5);
                              if (0 < iVar1) goto LAB_001bf4c7;
                              puVar6 = *local_60;
                              if (puVar6 == (uchar *)0x0) goto LAB_001bfdef;
                              iVar1 = strcmp((char *)puVar5,(char *)puVar6);
                              if (0 < iVar1) goto LAB_001beb30;
                              if (*local_50 == (uchar *)0x0) goto LAB_001bfdef;
                              iVar1 = strcmp((char *)puVar6,(char *)*local_50);
                              if (0 < iVar1) {
                                pcVar7 = "cmp(*from3, *from1) <= 0";
                                goto LAB_001bf4e0;
                              }
                              *(uchar **)((long)local_70 + lVar8) = puVar2;
                              if (n2 == 1) goto LAB_001bfd66;
                              puVar2 = *(uchar **)((long)local_68 + lVar8 + 8);
                              if (puVar2 == (uchar *)0x0) goto LAB_001bfe0e;
                              puVar5 = *local_58;
                              if (puVar5 == (uchar *)0x0) goto LAB_001bfdef;
                              iVar1 = strcmp((char *)puVar2,(char *)puVar5);
                              lVar8 = lVar8 + 8;
                              n2 = n2 - 1;
                            } while (iVar1 < 0);
                            __s1 = *local_60;
                            if (__s1 == (uchar *)0x0) break;
                            from2 = (uchar **)((long)local_68 + lVar8);
                            local_70 = (uchar **)((long)local_70 + lVar8);
                            iVar1 = strcmp((char *)puVar2,(char *)__s1);
                            local_68 = from2;
                            if (0 < iVar1) {
                              if (*local_50 == (uchar *)0x0) break;
                              iVar1 = strcmp((char *)puVar2,(char *)*local_50);
                              ppuVar3 = (uchar **)n2;
                              if (iVar1 < 0) goto LAB_001bf519;
                              goto LAB_001be2b5;
                            }
LAB_001beb48:
                            lVar8 = 0;
                            do {
                              iVar1 = strcmp((char *)puVar5,(char *)puVar2);
                              if (0 < iVar1) {
                                pcVar7 = "cmp(*from0, *from2) <= 0";
                                goto LAB_001bf4f8;
                              }
                              puVar6 = *local_60;
                              if (puVar6 == (uchar *)0x0) goto LAB_001bfdef;
                              iVar1 = strcmp((char *)puVar2,(char *)puVar6);
                              if (0 < iVar1) {
                                pcVar7 = "cmp(*from2, *from3) <= 0";
                                goto LAB_001bf4f8;
                              }
                              if (*local_50 == (uchar *)0x0) goto LAB_001bfdef;
                              iVar1 = strcmp((char *)puVar6,(char *)*local_50);
                              if (0 < iVar1) goto LAB_001bec50;
                              *(uchar **)((long)local_70 + lVar8) = puVar5;
                              from2 = local_68;
                              if (local_40 == 1) goto LAB_001bf611;
                              puVar5 = *(uchar **)((long)local_58 + lVar8 + 8);
                              if (puVar5 == (uchar *)0x0) goto LAB_001bfe0e;
                              puVar2 = *local_68;
                              if (puVar2 == (uchar *)0x0) goto LAB_001bfdef;
                              iVar1 = strcmp((char *)puVar5,(char *)puVar2);
                              lVar8 = lVar8 + 8;
                              local_40 = local_40 - 1;
                            } while (iVar1 < 1);
                            __s1 = *local_60;
                            if (__s1 == (uchar *)0x0) break;
                            local_58 = (uchar **)((long)local_58 + lVar8);
                            local_70 = (uchar **)((long)local_70 + lVar8);
                            iVar1 = strcmp((char *)puVar5,(char *)__s1);
                            if (0 < iVar1) {
                              if (*local_50 != (uchar *)0x0) {
                                iVar1 = strcmp((char *)puVar5,(char *)*local_50);
                                if (0 < iVar1) goto LAB_001be3ae;
LAB_001bfd2f:
                                lVar8 = 0;
                                do {
                                  iVar1 = strcmp((char *)puVar2,(char *)__s1);
                                  if (0 < iVar1) goto LAB_001bfe45;
                                  puVar5 = *local_58;
                                  if (puVar5 == (uchar *)0x0) goto LAB_001bfdef;
                                  iVar1 = strcmp((char *)__s1,(char *)puVar5);
                                  if (0 < iVar1) goto LAB_001bfe51;
                                  if (*local_50 == (uchar *)0x0) goto LAB_001bfdef;
                                  iVar1 = strcmp((char *)puVar5,(char *)*local_50);
                                  if (0 < iVar1) {
                                    pcVar7 = "cmp(*from0, *from1) <= 0";
                                    goto LAB_001bfb71;
                                  }
                                  *(uchar **)((long)local_70 + lVar8) = puVar2;
                                  if (n2 == 1) goto LAB_001bfd66;
                                  puVar2 = *(uchar **)((long)from2 + lVar8 + 8);
                                  if (puVar2 == (uchar *)0x0) goto LAB_001bfe0e;
                                  __s1 = *local_60;
                                  if (__s1 == (uchar *)0x0) goto LAB_001bfdef;
                                  iVar1 = strcmp((char *)puVar2,(char *)__s1);
                                  lVar8 = lVar8 + 8;
                                  n2 = n2 - 1;
                                } while (iVar1 < 1);
                                puVar5 = *local_58;
                                if (puVar5 != (uchar *)0x0) {
                                  from2 = (uchar **)((long)from2 + lVar8);
                                  local_70 = (uchar **)((long)local_70 + lVar8);
                                  iVar1 = strcmp((char *)puVar2,(char *)puVar5);
                                  if (iVar1 < 0) goto LAB_001bfc59;
                                  if (*local_50 == (uchar *)0x0) break;
                                  iVar1 = strcmp((char *)puVar2,(char *)*local_50);
                                  if (-1 < iVar1) goto LAB_001bdf67;
LAB_001bfa3c:
                                  lVar8 = 0;
                                  do {
                                    iVar1 = strcmp((char *)__s1,(char *)puVar5);
                                    if (0 < iVar1) goto LAB_001bfb40;
                                    puVar6 = *from2;
                                    if (puVar6 == (uchar *)0x0) goto LAB_001bfdef;
                                    iVar1 = strcmp((char *)puVar5,(char *)puVar6);
                                    if (0 < iVar1) goto LAB_001bfb49;
                                    if (*local_50 == (uchar *)0x0) goto LAB_001bfdef;
                                    iVar1 = strcmp((char *)puVar6,(char *)*local_50);
                                    if (0 < iVar1) {
                                      pcVar7 = "cmp(*from2, *from1) <= 0";
                                      goto LAB_001bfb59;
                                    }
                                    *(uchar **)((long)local_70 + lVar8) = __s1;
                                    ppuVar4 = from2;
                                    ppuVar3 = (uchar **)n2;
                                    if (local_48 == 1) goto LAB_001bfd37;
                                    __s1 = *(uchar **)((long)local_60 + lVar8 + 8);
                                    if (__s1 == (uchar *)0x0) goto LAB_001bfe0e;
                                    puVar5 = *local_58;
                                    if (puVar5 == (uchar *)0x0) goto LAB_001bfdef;
                                    iVar1 = strcmp((char *)__s1,(char *)puVar5);
                                    lVar8 = lVar8 + 8;
                                    local_48 = local_48 - 1;
                                  } while (iVar1 < 0);
                                  puVar2 = *from2;
                                  if (puVar2 == (uchar *)0x0) break;
                                  local_60 = (uchar **)((long)local_60 + lVar8);
                                  local_70 = (uchar **)((long)local_70 + lVar8);
                                  iVar1 = strcmp((char *)__s1,(char *)puVar2);
                                  if (iVar1 < 0) {
LAB_001bf519:
                                    lVar8 = 0;
                                    do {
                                      iVar1 = strcmp((char *)puVar5,(char *)__s1);
                                      if (0 < iVar1) goto LAB_001bf510;
                                      puVar6 = *from2;
                                      if (puVar6 == (uchar *)0x0) goto LAB_001bfdef;
                                      iVar1 = strcmp((char *)__s1,(char *)puVar6);
                                      if (0 < iVar1) {
                                        pcVar7 = "cmp(*from3, *from2) <= 0";
                                        goto LAB_001bf4f8;
                                      }
                                      if (*local_50 == (uchar *)0x0) goto LAB_001bfdef;
                                      iVar1 = strcmp((char *)puVar6,(char *)*local_50);
                                      if (0 < iVar1) {
                                        pcVar7 = "cmp(*from2, *from1) <= 0";
                                        goto LAB_001bf4f8;
                                      }
                                      *(uchar **)((long)local_70 + lVar8) = puVar5;
                                      if (local_40 == 1) goto LAB_001bf611;
                                      puVar5 = *(uchar **)((long)local_58 + lVar8 + 8);
                                      if (puVar5 == (uchar *)0x0) goto LAB_001bfe0e;
                                      __s1 = *local_60;
                                      if (__s1 == (uchar *)0x0) goto LAB_001bfdef;
                                      iVar1 = strcmp((char *)puVar5,(char *)__s1);
                                      lVar8 = lVar8 + 8;
                                      local_40 = local_40 - 1;
                                    } while (iVar1 < 1);
                                    puVar2 = *from2;
                                    if (puVar2 != (uchar *)0x0) {
                                      local_58 = (uchar **)((long)local_58 + lVar8);
                                      local_70 = (uchar **)((long)local_70 + lVar8);
                                      iVar1 = strcmp((char *)puVar5,(char *)puVar2);
                                      if (0 < iVar1) {
                                        if (*local_50 != (uchar *)0x0) {
                                          iVar1 = strcmp((char *)puVar5,(char *)*local_50);
                                          if (0 < iVar1) goto LAB_001be140;
LAB_001bfc59:
                                          lVar8 = 0;
                                          do {
                                            iVar1 = strcmp((char *)__s1,(char *)puVar2);
                                            if (0 < iVar1) goto LAB_001bfe2d;
                                            puVar5 = *local_58;
                                            if (puVar5 == (uchar *)0x0) goto LAB_001bfdef;
                                            iVar1 = strcmp((char *)puVar2,(char *)puVar5);
                                            if (0 < iVar1) goto LAB_001bfe39;
                                            if (*local_50 == (uchar *)0x0) goto LAB_001bfdef;
                                            iVar1 = strcmp((char *)puVar5,(char *)*local_50);
                                            if (0 < iVar1) {
                                              pcVar7 = "cmp(*from0, *from1) <= 0";
                                              goto LAB_001bf64b;
                                            }
                                            *(uchar **)((long)local_70 + lVar8) = __s1;
                                            ppuVar4 = from2;
                                            ppuVar3 = (uchar **)n2;
                                            if (local_48 == 1) goto LAB_001bfd37;
                                            __s1 = *(uchar **)((long)local_60 + lVar8 + 8);
                                            if (__s1 == (uchar *)0x0) goto LAB_001bfe0e;
                                            puVar2 = *from2;
                                            if (puVar2 == (uchar *)0x0) goto LAB_001bfdef;
                                            iVar1 = strcmp((char *)__s1,(char *)puVar2);
                                            lVar8 = lVar8 + 8;
                                            local_48 = local_48 - 1;
                                          } while (iVar1 < 0);
                                          puVar5 = *local_58;
                                          if (puVar5 != (uchar *)0x0) {
                                            local_60 = (uchar **)((long)local_60 + lVar8);
                                            local_70 = (uchar **)((long)local_70 + lVar8);
                                            iVar1 = strcmp((char *)__s1,(char *)puVar5);
                                            if (-1 < iVar1) {
                                              puVar6 = *local_50;
                                              local_68 = from2;
                                              if (puVar6 == (uchar *)0x0) break;
LAB_001bfddd:
                                              iVar1 = strcmp((char *)__s1,(char *)puVar6);
                                              if (iVar1 < 0) goto LAB_001bea31;
LAB_001bf3a9:
                                              lVar8 = 0;
                                              do {
                                                iVar1 = strcmp((char *)puVar2,(char *)puVar5);
                                                if (0 < iVar1) goto LAB_001bf4c7;
                                                puVar6 = *local_50;
                                                if (puVar6 == (uchar *)0x0) goto LAB_001bfdef;
                                                iVar1 = strcmp((char *)puVar5,(char *)puVar6);
                                                if (0 < iVar1) {
                                                  pcVar7 = "cmp(*from0, *from1) <= 0";
                                                  goto LAB_001bf4e0;
                                                }
                                                if (*local_60 == (uchar *)0x0) goto LAB_001bfdef;
                                                iVar1 = strcmp((char *)puVar6,(char *)*local_60);
                                                if (0 < iVar1) {
                                                  pcVar7 = "cmp(*from1, *from3) <= 0";
                                                  goto LAB_001bf4e0;
                                                }
                                                *(uchar **)((long)local_70 + lVar8) = puVar2;
                                                if (n2 == 1) goto LAB_001bf4b6;
                                                puVar2 = *(uchar **)((long)local_68 + lVar8 + 8);
                                                if (puVar2 == (uchar *)0x0) goto LAB_001bfe0e;
                                                puVar5 = *local_58;
                                                if (puVar5 == (uchar *)0x0) goto LAB_001bfdef;
                                                iVar1 = strcmp((char *)puVar2,(char *)puVar5);
                                                lVar8 = lVar8 + 8;
                                                n2 = n2 - 1;
                                              } while (iVar1 < 0);
                                              puVar6 = *local_50;
                                              if (puVar6 == (uchar *)0x0) break;
                                              from2 = (uchar **)((long)local_68 + lVar8);
                                              local_70 = (uchar **)((long)local_70 + lVar8);
                                              iVar1 = strcmp((char *)puVar2,(char *)puVar6);
                                              local_68 = from2;
                                              if (iVar1 < 0) goto LAB_001bf7a3;
                                              if (*local_60 == (uchar *)0x0) break;
                                              iVar1 = strcmp((char *)puVar2,(char *)*local_60);
                                              if (0 < iVar1) goto LAB_001bec74;
LAB_001bed9f:
                                              lVar8 = 0;
                                              do {
                                                iVar1 = strcmp((char *)puVar5,(char *)puVar6);
                                                if (0 < iVar1) goto LAB_001beeaa;
                                                puVar2 = *from2;
                                                if (puVar2 == (uchar *)0x0) goto LAB_001bfdef;
                                                iVar1 = strcmp((char *)puVar6,(char *)puVar2);
                                                if (0 < iVar1) {
                                                  pcVar7 = "cmp(*from1, *from2) <= 0";
                                                  goto LAB_001beff0;
                                                }
                                                if (*local_60 == (uchar *)0x0) goto LAB_001bfdef;
                                                iVar1 = strcmp((char *)puVar2,(char *)*local_60);
                                                if (0 < iVar1) {
                                                  pcVar7 = "cmp(*from2, *from3) <= 0";
                                                  goto LAB_001beff0;
                                                }
                                                *(uchar **)((long)local_70 + lVar8) = puVar5;
                                                if (local_40 == 1) {
                                                  local_70 = (uchar **)((long)local_70 + lVar8 + 8);
                                                  local_40 = local_38;
                                                  local_58 = local_50;
                                                  ppuVar3 = (uchar **)local_48;
                                                  goto LAB_001bfd97;
                                                }
                                                puVar5 = *(uchar **)((long)local_58 + lVar8 + 8);
                                                if (puVar5 == (uchar *)0x0) goto LAB_001bfe0e;
                                                puVar6 = *local_50;
                                                if (puVar6 == (uchar *)0x0) goto LAB_001bfdef;
                                                iVar1 = strcmp((char *)puVar5,(char *)puVar6);
                                                lVar8 = lVar8 + 8;
                                                local_40 = local_40 - 1;
                                              } while (iVar1 < 1);
                                              puVar2 = *from2;
                                              if (puVar2 == (uchar *)0x0) break;
                                              local_58 = (uchar **)((long)local_58 + lVar8);
                                              local_70 = (uchar **)((long)local_70 + lVar8);
                                              iVar1 = strcmp((char *)puVar5,(char *)puVar2);
                                              if (iVar1 < 1) goto LAB_001bfa04;
                                              if (*local_60 == (uchar *)0x0) break;
                                              iVar1 = strcmp((char *)puVar5,(char *)*local_60);
                                              local_68 = from2;
                                              if (iVar1 < 1) goto LAB_001be910;
LAB_001beece:
                                              while( true ) {
                                                lVar8 = 0;
                                                do {
                                                  iVar1 = strcmp((char *)puVar6,(char *)puVar2);
                                                  if (0 < iVar1) {
                                                    pcVar7 = "cmp(*from1, *from2) <= 0";
                                                    goto LAB_001bf008;
                                                  }
                                                  puVar5 = *local_60;
                                                  if (puVar5 == (uchar *)0x0) goto LAB_001bfdef;
                                                  iVar1 = strcmp((char *)puVar2,(char *)puVar5);
                                                  if (0 < iVar1) {
                                                    pcVar7 = "cmp(*from2, *from3) <= 0";
                                                    goto LAB_001bf008;
                                                  }
                                                  if (*local_58 == (uchar *)0x0) goto LAB_001bfdef;
                                                  iVar1 = strcmp((char *)puVar5,(char *)*local_58);
                                                  if (0 < iVar1) goto LAB_001bf7b0;
                                                  *(uchar **)((long)local_70 + lVar8) = puVar6;
                                                  from2 = local_68;
                                                  ppuVar3 = (uchar **)n2;
                                                  if (local_38 == 1) goto LAB_001bf994;
                                                  puVar6 = *(uchar **)((long)local_50 + lVar8 + 8);
                                                  if (puVar6 == (uchar *)0x0) goto LAB_001bfe0e;
                                                  puVar2 = *local_68;
                                                  if (puVar2 == (uchar *)0x0) goto LAB_001bfdef;
                                                  iVar1 = strcmp((char *)puVar6,(char *)puVar2);
                                                  lVar8 = lVar8 + 8;
                                                  local_38 = local_38 - 1;
                                                } while (iVar1 < 1);
                                                __s1 = *local_60;
                                                if (__s1 == (uchar *)0x0) goto LAB_001bfdef;
                                                local_50 = (uchar **)((long)local_50 + lVar8);
                                                local_70 = (uchar **)((long)local_70 + lVar8);
                                                iVar1 = strcmp((char *)puVar6,(char *)__s1);
                                                if (0 < iVar1) break;
                                                while( true ) {
                                                  lVar8 = 0;
                                                  do {
                                                    iVar1 = strcmp((char *)puVar2,(char *)puVar6);
                                                    if (0 < iVar1) {
                                                      pcVar7 = "cmp(*from2, *from1) <= 0";
                                                      goto LAB_001bfb71;
                                                    }
                                                    puVar5 = *local_60;
                                                    if (puVar5 == (uchar *)0x0) goto LAB_001bfdef;
                                                    iVar1 = strcmp((char *)puVar6,(char *)puVar5);
                                                    if (0 < iVar1) {
                                                      pcVar7 = "cmp(*from1, *from3) <= 0";
                                                      goto LAB_001bfb71;
                                                    }
                                                    if (*local_58 == (uchar *)0x0)
                                                    goto LAB_001bfdef;
                                                    iVar1 = strcmp((char *)puVar5,(char *)*local_58)
                                                    ;
                                                    if (0 < iVar1) goto LAB_001bfe51;
                                                    *(uchar **)((long)local_70 + lVar8) = puVar2;
                                                    if (n2 == 1) goto LAB_001bf4b6;
                                                    puVar2 = *(uchar **)((long)local_68 + lVar8 + 8)
                                                    ;
                                                    if (puVar2 == (uchar *)0x0) goto LAB_001bfe0e;
                                                    puVar6 = *local_50;
                                                    if (puVar6 == (uchar *)0x0) goto LAB_001bfdef;
                                                    iVar1 = strcmp((char *)puVar2,(char *)puVar6);
                                                    lVar8 = lVar8 + 8;
                                                    n2 = n2 - 1;
                                                  } while (iVar1 < 0);
                                                  __s1 = *local_60;
                                                  if (__s1 == (uchar *)0x0) goto LAB_001bfdef;
                                                  from2 = (uchar **)((long)local_68 + lVar8);
                                                  local_70 = (uchar **)((long)local_70 + lVar8);
                                                  iVar1 = strcmp((char *)puVar2,(char *)__s1);
                                                  local_68 = from2;
                                                  if (iVar1 < 1) break;
                                                  if (*local_58 == (uchar *)0x0) goto LAB_001bfdef;
                                                  iVar1 = strcmp((char *)puVar2,(char *)*local_58);
                                                  if (-1 < iVar1) goto LAB_001bf971;
LAB_001bf254:
                                                  lVar8 = 0;
                                                  do {
                                                    iVar1 = strcmp((char *)puVar6,(char *)__s1);
                                                    if (0 < iVar1) goto LAB_001bfa0c;
                                                    puVar5 = *from2;
                                                    if (puVar5 == (uchar *)0x0) goto LAB_001bfdef;
                                                    iVar1 = strcmp((char *)__s1,(char *)puVar5);
                                                    if (0 < iVar1) {
                                                      pcVar7 = "cmp(*from3, *from2) <= 0";
                                                      goto LAB_001bf008;
                                                    }
                                                    if (*local_58 == (uchar *)0x0)
                                                    goto LAB_001bfdef;
                                                    iVar1 = strcmp((char *)puVar5,(char *)*local_58)
                                                    ;
                                                    if (0 < iVar1) {
                                                      pcVar7 = "cmp(*from2, *from0) <= 0";
                                                      goto LAB_001bf008;
                                                    }
                                                    *(uchar **)((long)local_70 + lVar8) = puVar6;
                                                    if (local_38 == 1) {
                                                      local_70 = (uchar **)
                                                                 ((long)local_70 + lVar8 + 8);
                                                      ppuVar3 = (uchar **)local_48;
                                                      goto LAB_001bfd97;
                                                    }
                                                    puVar6 = *(uchar **)((long)local_50 + lVar8 + 8)
                                                    ;
                                                    if (puVar6 == (uchar *)0x0) goto LAB_001bfe0e;
                                                    __s1 = *local_60;
                                                    if (__s1 == (uchar *)0x0) goto LAB_001bfdef;
                                                    iVar1 = strcmp((char *)puVar6,(char *)__s1);
                                                    lVar8 = lVar8 + 8;
                                                    local_38 = local_38 - 1;
                                                  } while (iVar1 < 1);
                                                  puVar2 = *from2;
                                                  if (puVar2 == (uchar *)0x0) goto LAB_001bfdef;
                                                  local_50 = (uchar **)((long)local_50 + lVar8);
                                                  local_70 = (uchar **)((long)local_70 + lVar8);
                                                  iVar1 = strcmp((char *)puVar6,(char *)puVar2);
                                                  local_68 = from2;
                                                  ppuVar3 = (uchar **)n2;
                                                  if (iVar1 < 1) goto LAB_001be7ed;
                                                  if (*local_58 == (uchar *)0x0) goto LAB_001bfdef;
                                                  iVar1 = strcmp((char *)puVar6,(char *)*local_58);
                                                  if (-1 < iVar1) goto LAB_001bfc59;
LAB_001be140:
                                                  while( true ) {
                                                    lVar8 = 0;
                                                    do {
                                                      iVar1 = strcmp((char *)__s1,(char *)puVar2);
                                                      if (0 < iVar1) goto LAB_001bfe2d;
                                                      puVar5 = *local_50;
                                                      if (puVar5 == (uchar *)0x0) goto LAB_001bfdef;
                                                      iVar1 = strcmp((char *)puVar2,(char *)puVar5);
                                                      if (0 < iVar1) {
                                                        pcVar7 = "cmp(*from2, *from1) <= 0";
                                                        goto LAB_001bf64b;
                                                      }
                                                      if (*local_58 == (uchar *)0x0)
                                                      goto LAB_001bfdef;
                                                      iVar1 = strcmp((char *)puVar5,
                                                                     (char *)*local_58);
                                                      if (0 < iVar1) {
                                                        pcVar7 = "cmp(*from1, *from0) <= 0";
                                                        goto LAB_001bf64b;
                                                      }
                                                      *(uchar **)((long)local_70 + lVar8) = __s1;
                                                      ppuVar3 = from2;
                                                      local_68 = (uchar **)n2;
                                                      if (local_48 == 1) goto LAB_001bf97e;
                                                      __s1 = *(uchar **)((long)local_60 + lVar8 + 8)
                                                      ;
                                                      if (__s1 == (uchar *)0x0) goto LAB_001bfe0e;
                                                      puVar2 = *from2;
                                                      if (puVar2 == (uchar *)0x0) goto LAB_001bfdef;
                                                      iVar1 = strcmp((char *)__s1,(char *)puVar2);
                                                      lVar8 = lVar8 + 8;
                                                      local_48 = local_48 - 1;
                                                    } while (iVar1 < 0);
                                                    puVar6 = *local_50;
                                                    if (puVar6 == (uchar *)0x0) goto LAB_001bfdef;
                                                    local_60 = (uchar **)((long)local_60 + lVar8);
                                                    local_70 = (uchar **)((long)local_70 + lVar8);
                                                    iVar1 = strcmp((char *)__s1,(char *)puVar6);
                                                    local_68 = from2;
                                                    if (-1 < iVar1) break;
LAB_001be3ae:
                                                    lVar8 = 0;
                                                    do {
                                                      iVar1 = strcmp((char *)puVar2,(char *)__s1);
                                                      if (0 < iVar1) goto LAB_001bfe45;
                                                      puVar5 = *local_50;
                                                      if (puVar5 == (uchar *)0x0) goto LAB_001bfdef;
                                                      iVar1 = strcmp((char *)__s1,(char *)puVar5);
                                                      if (0 < iVar1) {
                                                        pcVar7 = "cmp(*from3, *from1) <= 0";
                                                        goto LAB_001bfb71;
                                                      }
                                                      if (*local_58 == (uchar *)0x0)
                                                      goto LAB_001bfdef;
                                                      iVar1 = strcmp((char *)puVar5,
                                                                     (char *)*local_58);
                                                      if (0 < iVar1) {
                                                        pcVar7 = "cmp(*from1, *from0) <= 0";
                                                        goto LAB_001bfb71;
                                                      }
                                                      *(uchar **)((long)local_70 + lVar8) = puVar2;
                                                      if (n2 == 1) goto LAB_001bf4b6;
                                                      puVar2 = *(uchar **)
                                                                ((long)local_68 + lVar8 + 8);
                                                      if (puVar2 == (uchar *)0x0) goto LAB_001bfe0e;
                                                      __s1 = *local_60;
                                                      if (__s1 == (uchar *)0x0) goto LAB_001bfdef;
                                                      iVar1 = strcmp((char *)puVar2,(char *)__s1);
                                                      lVar8 = lVar8 + 8;
                                                      n2 = n2 - 1;
                                                    } while (iVar1 < 1);
                                                    puVar6 = *local_50;
                                                    if (puVar6 == (uchar *)0x0) goto LAB_001bfdef;
                                                    from2 = (uchar **)((long)local_68 + lVar8);
                                                    local_70 = (uchar **)((long)local_70 + lVar8);
                                                    iVar1 = strcmp((char *)puVar2,(char *)puVar6);
                                                    if (-1 < iVar1) {
                                                      if (*local_58 == (uchar *)0x0)
                                                      goto LAB_001bfdef;
                                                      iVar1 = strcmp((char *)puVar2,
                                                                     (char *)*local_58);
                                                      local_68 = from2;
                                                      ppuVar3 = (uchar **)n2;
                                                      if (-1 < iVar1) goto LAB_001bf894;
                                                      goto LAB_001be7ed;
                                                    }
                                                  }
                                                  puVar5 = *local_58;
                                                  if (puVar5 == (uchar *)0x0) goto LAB_001bfdef;
LAB_001be4d3:
                                                  iVar1 = strcmp((char *)__s1,(char *)puVar5);
                                                  if (-1 < iVar1) {
LAB_001be5b5:
                                                    do {
                                                      lVar8 = 0;
                                                      do {
                                                        iVar1 = strcmp((char *)puVar2,(char *)puVar6
                                                                      );
                                                        if (0 < iVar1) {
                                                          pcVar7 = "cmp(*from2, *from1) <= 0";
                                                          goto LAB_001bf4e0;
                                                        }
                                                        puVar5 = *local_58;
                                                        if (puVar5 == (uchar *)0x0)
                                                        goto LAB_001bfdef;
                                                        iVar1 = strcmp((char *)puVar6,(char *)puVar5
                                                                      );
                                                        if (0 < iVar1) {
                                                          pcVar7 = "cmp(*from1, *from0) <= 0";
                                                          goto LAB_001bf4e0;
                                                        }
                                                        if (*local_60 == (uchar *)0x0)
                                                        goto LAB_001bfdef;
                                                        iVar1 = strcmp((char *)puVar5,
                                                                       (char *)*local_60);
                                                        if (0 < iVar1) goto LAB_001beb30;
                                                        *(uchar **)((long)local_70 + lVar8) = puVar2
                                                        ;
                                                        if (n2 == 1) {
                                                          local_70 = (uchar **)
                                                                     ((long)local_70 + lVar8 + 8);
                                                          n2 = local_38;
                                                          from2 = local_50;
                                                          ppuVar3 = (uchar **)local_48;
                                                          goto LAB_001bfd97;
                                                        }
                                                        puVar2 = *(uchar **)
                                                                  ((long)local_68 + lVar8 + 8);
                                                        if (puVar2 == (uchar *)0x0)
                                                        goto LAB_001bfe0e;
                                                        puVar6 = *local_50;
                                                        if (puVar6 == (uchar *)0x0)
                                                        goto LAB_001bfdef;
                                                        iVar1 = strcmp((char *)puVar2,(char *)puVar6
                                                                      );
                                                        lVar8 = lVar8 + 8;
                                                        n2 = n2 - 1;
                                                      } while (iVar1 < 0);
                                                      puVar5 = *local_58;
                                                      if (puVar5 == (uchar *)0x0) goto LAB_001bfdef;
                                                      local_68 = (uchar **)((long)local_68 + lVar8);
                                                      local_70 = (uchar **)((long)local_70 + lVar8);
                                                      iVar1 = strcmp((char *)puVar2,(char *)puVar5);
                                                      if (iVar1 < 0) goto LAB_001be910;
                                                      if (*local_60 == (uchar *)0x0)
                                                      goto LAB_001bfdef;
                                                      iVar1 = strcmp((char *)puVar2,
                                                                     (char *)*local_60);
                                                      from2 = local_68;
                                                      if (0 < iVar1) {
                                                        do {
                                                          do {
                                                            lVar8 = 0;
                                                            do {
                                                              iVar1 = strcmp((char *)puVar6,
                                                                             (char *)puVar5);
                                                              if (0 < iVar1) goto LAB_001bf772;
                                                              puVar2 = *local_60;
                                                              if (puVar2 == (uchar *)0x0)
                                                              goto LAB_001bfdef;
                                                              iVar1 = strcmp((char *)puVar5,
                                                                             (char *)puVar2);
                                                              if (0 < iVar1) goto LAB_001bea0d;
                                                              if (*from2 == (uchar *)0x0)
                                                              goto LAB_001bfdef;
                                                              iVar1 = strcmp((char *)puVar2,
                                                                             (char *)*from2);
                                                              if (0 < iVar1) {
                                                                pcVar7 = "cmp(*from3, *from2) <= 0";
                                                                goto LAB_001bf78b;
                                                              }
                                                              *(uchar **)((long)local_70 + lVar8) =
                                                                   puVar6;
                                                              ppuVar3 = (uchar **)n2;
                                                              if (local_38 == 1) goto LAB_001bf994;
                                                              puVar6 = *(uchar **)
                                                                        ((long)local_50 + lVar8 + 8)
                                                              ;
                                                              if (puVar6 == (uchar *)0x0)
                                                              goto LAB_001bfe0e;
                                                              puVar5 = *local_58;
                                                              if (puVar5 == (uchar *)0x0)
                                                              goto LAB_001bfdef;
                                                              iVar1 = strcmp((char *)puVar6,
                                                                             (char *)puVar5);
                                                              lVar8 = lVar8 + 8;
                                                              local_38 = local_38 - 1;
                                                            } while (iVar1 < 0);
                                                            __s1 = *local_60;
                                                            if (__s1 == (uchar *)0x0)
                                                            goto LAB_001bfdef;
                                                            local_50 = (uchar **)
                                                                       ((long)local_50 + lVar8);
                                                            local_70 = (uchar **)
                                                                       ((long)local_70 + lVar8);
                                                            iVar1 = strcmp((char *)puVar6,
                                                                           (char *)__s1);
                                                            if (0 < iVar1) {
                                                              if (*from2 == (uchar *)0x0)
                                                              goto LAB_001bfdef;
                                                              iVar1 = strcmp((char *)puVar6,
                                                                             (char *)*from2);
                                                              local_68 = from2;
                                                              ppuVar3 = (uchar **)n2;
                                                              if (0 < iVar1) goto LAB_001bf519;
                                                              goto LAB_001be2b5;
                                                            }
LAB_001bec74:
                                                            lVar8 = 0;
                                                            do {
                                                              iVar1 = strcmp((char *)puVar5,
                                                                             (char *)puVar6);
                                                              if (0 < iVar1) goto LAB_001beeaa;
                                                              puVar2 = *local_60;
                                                              if (puVar2 == (uchar *)0x0)
                                                              goto LAB_001bfdef;
                                                              iVar1 = strcmp((char *)puVar6,
                                                                             (char *)puVar2);
                                                              if (0 < iVar1) goto LAB_001bf020;
                                                              if (*from2 == (uchar *)0x0)
                                                              goto LAB_001bfdef;
                                                              iVar1 = strcmp((char *)puVar2,
                                                                             (char *)*from2);
                                                              if (0 < iVar1) {
                                                                pcVar7 = "cmp(*from3, *from2) <= 0";
                                                                goto LAB_001beff0;
                                                              }
                                                              *(uchar **)((long)local_70 + lVar8) =
                                                                   puVar5;
                                                              ppuVar4 = local_50;
                                                              ppuVar3 = (uchar **)n2;
                                                              if (local_40 == 1) goto LAB_001bed56;
                                                              puVar5 = *(uchar **)
                                                                        ((long)local_58 + lVar8 + 8)
                                                              ;
                                                              if (puVar5 == (uchar *)0x0)
                                                              goto LAB_001bfe0e;
                                                              puVar6 = *local_50;
                                                              if (puVar6 == (uchar *)0x0)
                                                              goto LAB_001bfdef;
                                                              iVar1 = strcmp((char *)puVar5,
                                                                             (char *)puVar6);
                                                              lVar8 = lVar8 + 8;
                                                              local_40 = local_40 - 1;
                                                            } while (iVar1 < 1);
                                                            __s1 = *local_60;
                                                            if (__s1 == (uchar *)0x0)
                                                            goto LAB_001bfdef;
                                                            local_58 = (uchar **)
                                                                       ((long)local_58 + lVar8);
                                                            local_70 = (uchar **)
                                                                       ((long)local_70 + lVar8);
                                                            iVar1 = strcmp((char *)puVar5,
                                                                           (char *)__s1);
                                                          } while (iVar1 < 1);
                                                          if (*from2 == (uchar *)0x0)
                                                          goto LAB_001bfdef;
                                                          iVar1 = strcmp((char *)puVar5,
                                                                         (char *)*from2);
                                                          if (0 < iVar1) goto LAB_001bf254;
LAB_001bf971:
                                                          do {
                                                            lVar8 = 0;
                                                            do {
                                                              iVar1 = strcmp((char *)puVar6,
                                                                             (char *)__s1);
                                                              if (0 < iVar1) goto LAB_001bfa0c;
                                                              puVar5 = *local_58;
                                                              if (puVar5 == (uchar *)0x0)
                                                              goto LAB_001bfdef;
                                                              iVar1 = strcmp((char *)__s1,
                                                                             (char *)puVar5);
                                                              if (0 < iVar1) goto LAB_001bf7b0;
                                                              if (*from2 == (uchar *)0x0)
                                                              goto LAB_001bfdef;
                                                              iVar1 = strcmp((char *)puVar5,
                                                                             (char *)*from2);
                                                              if (0 < iVar1) {
                                                                pcVar7 = "cmp(*from0, *from2) <= 0";
                                                                goto LAB_001bf008;
                                                              }
                                                              *(uchar **)((long)local_70 + lVar8) =
                                                                   puVar6;
                                                              ppuVar3 = (uchar **)n2;
                                                              if (local_38 == 1) goto LAB_001bf994;
                                                              puVar6 = *(uchar **)
                                                                        ((long)local_50 + lVar8 + 8)
                                                              ;
                                                              if (puVar6 == (uchar *)0x0)
                                                              goto LAB_001bfe0e;
                                                              __s1 = *local_60;
                                                              if (__s1 == (uchar *)0x0)
                                                              goto LAB_001bfdef;
                                                              iVar1 = strcmp((char *)puVar6,
                                                                             (char *)__s1);
                                                              lVar8 = lVar8 + 8;
                                                              local_38 = local_38 - 1;
                                                            } while (iVar1 < 1);
                                                            puVar5 = *local_58;
                                                            if (puVar5 == (uchar *)0x0)
                                                            goto LAB_001bfdef;
                                                            local_50 = (uchar **)
                                                                       ((long)local_50 + lVar8);
                                                            local_70 = (uchar **)
                                                                       ((long)local_70 + lVar8);
                                                            iVar1 = strcmp((char *)puVar6,
                                                                           (char *)puVar5);
                                                            if (-1 < iVar1) {
                                                              if (*from2 == (uchar *)0x0)
                                                              goto LAB_001bfdef;
                                                              iVar1 = strcmp((char *)puVar6,
                                                                             (char *)*from2);
                                                              if (0 < iVar1) goto LAB_001bfa3c;
                                                              goto LAB_001bdf67;
                                                            }
LAB_001bf894:
                                                            lVar8 = 0;
                                                            do {
                                                              iVar1 = strcmp((char *)__s1,
                                                                             (char *)puVar6);
                                                              if (0 < iVar1) {
                                                                pcVar7 = "cmp(*from3, *from1) <= 0";
                                                                goto LAB_001bfb59;
                                                              }
                                                              puVar5 = *local_58;
                                                              if (puVar5 == (uchar *)0x0)
                                                              goto LAB_001bfdef;
                                                              iVar1 = strcmp((char *)puVar6,
                                                                             (char *)puVar5);
                                                              if (0 < iVar1) {
                                                                pcVar7 = "cmp(*from1, *from0) <= 0";
                                                                goto LAB_001bfb59;
                                                              }
                                                              if (*from2 == (uchar *)0x0)
                                                              goto LAB_001bfdef;
                                                              iVar1 = strcmp((char *)puVar5,
                                                                             (char *)*from2);
                                                              if (0 < iVar1) goto LAB_001bfb49;
                                                              *(uchar **)((long)local_70 + lVar8) =
                                                                   __s1;
                                                              ppuVar3 = from2;
                                                              local_68 = (uchar **)n2;
                                                              if (local_48 == 1) goto LAB_001bf97e;
                                                              __s1 = *(uchar **)
                                                                      ((long)local_60 + lVar8 + 8);
                                                              if (__s1 == (uchar *)0x0)
                                                              goto LAB_001bfe0e;
                                                              puVar6 = *local_50;
                                                              if (puVar6 == (uchar *)0x0)
                                                              goto LAB_001bfdef;
                                                              iVar1 = strcmp((char *)__s1,
                                                                             (char *)puVar6);
                                                              lVar8 = lVar8 + 8;
                                                              local_48 = local_48 - 1;
                                                            } while (iVar1 < 0);
                                                            puVar5 = *local_58;
                                                            if (puVar5 == (uchar *)0x0)
                                                            goto LAB_001bfdef;
                                                            local_60 = (uchar **)
                                                                       ((long)local_60 + lVar8);
                                                            local_70 = (uchar **)
                                                                       ((long)local_70 + lVar8);
                                                            iVar1 = strcmp((char *)__s1,
                                                                           (char *)puVar5);
                                                          } while (iVar1 < 0);
                                                          puVar2 = *from2;
                                                          if (puVar2 == (uchar *)0x0)
                                                          goto LAB_001bfdef;
LAB_001bf9f7:
                                                          iVar1 = strcmp((char *)__s1,(char *)puVar2
                                                                        );
                                                        } while (iVar1 < 0);
                                                      }
LAB_001bfa04:
                                                      lVar8 = 0;
                                                      do {
                                                        iVar1 = strcmp((char *)puVar6,(char *)puVar5
                                                                      );
                                                        if (0 < iVar1) goto LAB_001bf772;
                                                        puVar2 = *from2;
                                                        if (puVar2 == (uchar *)0x0)
                                                        goto LAB_001bfdef;
                                                        iVar1 = strcmp((char *)puVar5,(char *)puVar2
                                                                      );
                                                        if (0 < iVar1) {
                                                          pcVar7 = "cmp(*from0, *from2) <= 0";
                                                          goto LAB_001bf78b;
                                                        }
                                                        if (*local_60 == (uchar *)0x0)
                                                        goto LAB_001bfdef;
                                                        iVar1 = strcmp((char *)puVar2,
                                                                       (char *)*local_60);
                                                        if (0 < iVar1) {
                                                          pcVar7 = "cmp(*from2, *from3) <= 0";
                                                          goto LAB_001bf78b;
                                                        }
                                                        *(uchar **)((long)local_70 + lVar8) = puVar6
                                                        ;
                                                        if (local_38 == 1) goto LAB_001bf761;
                                                        puVar6 = *(uchar **)
                                                                  ((long)local_50 + lVar8 + 8);
                                                        if (puVar6 == (uchar *)0x0)
                                                        goto LAB_001bfe0e;
                                                        puVar5 = *local_58;
                                                        if (puVar5 == (uchar *)0x0)
                                                        goto LAB_001bfdef;
                                                        iVar1 = strcmp((char *)puVar6,(char *)puVar5
                                                                      );
                                                        lVar8 = lVar8 + 8;
                                                        local_38 = local_38 - 1;
                                                      } while (iVar1 < 0);
                                                      puVar2 = *from2;
                                                      if (puVar2 == (uchar *)0x0) goto LAB_001bfdef;
                                                      local_50 = (uchar **)((long)local_50 + lVar8);
                                                      local_70 = (uchar **)((long)local_70 + lVar8);
                                                      iVar1 = strcmp((char *)puVar6,(char *)puVar2);
                                                      if (iVar1 < 1) goto LAB_001bed9f;
                                                      if (*local_60 == (uchar *)0x0)
                                                      goto LAB_001bfdef;
                                                      iVar1 = strcmp((char *)puVar6,
                                                                     (char *)*local_60);
                                                      local_68 = from2;
                                                      if (0 < iVar1) goto LAB_001beb48;
LAB_001bf7a3:
                                                      lVar8 = 0;
                                                      do {
                                                        iVar1 = strcmp((char *)puVar5,(char *)puVar2
                                                                      );
                                                        if (0 < iVar1) {
                                                          pcVar7 = "cmp(*from0, *from2) <= 0";
                                                          goto LAB_001beff0;
                                                        }
                                                        puVar6 = *local_50;
                                                        if (puVar6 == (uchar *)0x0)
                                                        goto LAB_001bfdef;
                                                        iVar1 = strcmp((char *)puVar2,(char *)puVar6
                                                                      );
                                                        if (0 < iVar1) {
                                                          pcVar7 = "cmp(*from2, *from1) <= 0";
                                                          goto LAB_001beff0;
                                                        }
                                                        if (*local_60 == (uchar *)0x0)
                                                        goto LAB_001bfdef;
                                                        iVar1 = strcmp((char *)puVar6,
                                                                       (char *)*local_60);
                                                        if (0 < iVar1) goto LAB_001bf020;
                                                        *(uchar **)((long)local_70 + lVar8) = puVar5
                                                        ;
                                                        if (local_40 == 1) {
                                                          local_70 = (uchar **)
                                                                     ((long)local_70 + lVar8 + 8);
                                                          from2 = local_68;
                                                          local_40 = local_38;
                                                          local_58 = local_50;
                                                          ppuVar3 = (uchar **)local_48;
                                                          goto LAB_001bfd97;
                                                        }
                                                        puVar5 = *(uchar **)
                                                                  ((long)local_58 + lVar8 + 8);
                                                        if (puVar5 == (uchar *)0x0)
                                                        goto LAB_001bfe0e;
                                                        puVar2 = *local_68;
                                                        if (puVar2 == (uchar *)0x0)
                                                        goto LAB_001bfdef;
                                                        iVar1 = strcmp((char *)puVar5,(char *)puVar2
                                                                      );
                                                        lVar8 = lVar8 + 8;
                                                        local_40 = local_40 - 1;
                                                      } while (iVar1 < 1);
                                                      puVar6 = *local_50;
                                                      if (puVar6 == (uchar *)0x0) goto LAB_001bfdef;
                                                      local_58 = (uchar **)((long)local_58 + lVar8);
                                                      local_70 = (uchar **)((long)local_70 + lVar8);
                                                      iVar1 = strcmp((char *)puVar5,(char *)puVar6);
                                                      if (iVar1 < 1) goto LAB_001bf3a9;
                                                      if (*local_60 == (uchar *)0x0)
                                                      goto LAB_001bfdef;
                                                      iVar1 = strcmp((char *)puVar5,
                                                                     (char *)*local_60);
                                                    } while (iVar1 < 1);
                                                  }
                                                }
                                              }
                                              if (*local_58 == (uchar *)0x0) break;
                                              iVar1 = strcmp((char *)puVar6,(char *)*local_58);
                                              if (iVar1 < 0) goto LAB_001be3ae;
                                            }
                                            goto LAB_001bfd2f;
                                          }
                                        }
                                        break;
                                      }
                                      goto LAB_001bfa3c;
                                    }
                                    break;
                                  }
                                  puVar6 = *local_50;
                                  local_68 = from2;
                                  if (puVar6 == (uchar *)0x0) break;
LAB_001bfb2e:
                                  iVar1 = strcmp((char *)__s1,(char *)puVar6);
                                  if (-1 < iVar1) goto LAB_001bf7a3;
                                  goto LAB_001beb48;
                                }
                              }
                              break;
                            }
                          } while( true );
                        }
                      }
                    }
                  }
                }
                goto LAB_001bfdef;
              }
              goto LAB_001bdf67;
            }
            if (*from2 != (uchar *)0x0) {
              iVar1 = strcmp((char *)__s1,(char *)*from2);
              if (-1 < iVar1) goto LAB_001bed9f;
              goto LAB_001bec74;
            }
            goto LAB_001bfdef;
          }
        }
        else {
          iVar1 = strcmp((char *)puVar2,(char *)puVar5);
          __s1 = *from3;
          if (iVar1 < 0) {
            if (__s1 != (uchar *)0x0) {
              iVar1 = strcmp((char *)__s1,(char *)puVar2);
              if (iVar1 < 0) goto LAB_001bfc59;
              iVar1 = strcmp((char *)__s1,(char *)puVar5);
              if (iVar1 < 0) goto LAB_001bfd2f;
              goto LAB_001bfddd;
            }
          }
          else if (__s1 != (uchar *)0x0) {
            iVar1 = strcmp((char *)__s1,(char *)puVar5);
            if (iVar1 < 0) goto LAB_001bfa3c;
            iVar1 = strcmp((char *)__s1,(char *)puVar2);
            if (iVar1 < 0) goto LAB_001bf519;
            goto LAB_001bfb2e;
          }
        }
LAB_001bfe0e:
        __assert_fail("a != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                      ,0x32,"int cmp(const unsigned char *, const unsigned char *)");
      }
    }
    else if (puVar2 != (uchar *)0x0) {
      iVar1 = strcmp((char *)puVar6,(char *)puVar2);
      if (iVar1 < 1) {
        iVar1 = strcmp((char *)puVar5,(char *)puVar2);
        __s1 = *from3;
        if (iVar1 < 1) {
          if (__s1 != (uchar *)0x0) {
            iVar1 = strcmp((char *)__s1,(char *)puVar6);
            if (iVar1 < 0) goto LAB_001bf894;
            iVar1 = strcmp((char *)__s1,(char *)puVar5);
            if (iVar1 < 0) goto LAB_001bf971;
            goto LAB_001bf9f7;
          }
        }
        else if (__s1 != (uchar *)0x0) {
          iVar1 = strcmp((char *)__s1,(char *)puVar6);
          if (iVar1 < 0) goto LAB_001be7ed;
          iVar1 = strcmp((char *)__s1,(char *)puVar2);
          if (iVar1 < 0) goto LAB_001bf254;
          goto LAB_001be8d8;
        }
      }
      else {
        __s1 = *from3;
        if (__s1 != (uchar *)0x0) {
          iVar1 = strcmp((char *)__s1,(char *)puVar2);
          if (iVar1 < 0) goto LAB_001be140;
          iVar1 = strcmp((char *)__s1,(char *)puVar6);
          if (iVar1 < 0) goto LAB_001be3ae;
          goto LAB_001be4d3;
        }
      }
      goto LAB_001bfe0e;
    }
  }
LAB_001bfdef:
  __assert_fail("b != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                ,0x33,"int cmp(const unsigned char *, const unsigned char *)");
LAB_001bec50:
  pcVar7 = "cmp(*from3, *from1) <= 0";
  goto LAB_001bf4f8;
LAB_001bfd66:
  local_70 = (uchar **)((long)local_70 + lVar8 + 8);
  n2 = local_38;
  from2 = local_50;
  ppuVar3 = (uchar **)local_48;
  goto LAB_001bfd97;
LAB_001bf611:
  local_70 = (uchar **)((long)local_70 + lVar8 + 8);
  local_40 = local_38;
  local_58 = local_50;
  ppuVar3 = (uchar **)local_48;
  goto LAB_001bfd97;
LAB_001bfd37:
  local_70 = (uchar **)((long)local_70 + lVar8 + 8);
  n2 = local_38;
  from2 = local_50;
  local_60 = ppuVar4;
  goto LAB_001bfd97;
LAB_001bf4c7:
  pcVar7 = "cmp(*from2, *from0) <= 0";
  goto LAB_001bf4e0;
LAB_001bfe51:
  pcVar7 = "cmp(*from3, *from0) <= 0";
  goto LAB_001bfb71;
LAB_001bfe2d:
  pcVar7 = "cmp(*from3, *from2) <= 0";
  goto LAB_001bf64b;
LAB_001bf4b6:
  local_70 = (uchar **)((long)local_70 + lVar8 + 8);
  n2 = local_38;
  from2 = local_50;
  ppuVar3 = (uchar **)local_48;
  goto LAB_001bfd97;
LAB_001beeaa:
  pcVar7 = "cmp(*from0, *from1) <= 0";
  goto LAB_001beff0;
LAB_001bed56:
  local_68 = ppuVar3;
  local_58 = ppuVar4;
  local_70 = (uchar **)((long)local_70 + lVar8 + 8);
  n2 = (size_t)local_68;
  local_40 = local_38;
  ppuVar3 = (uchar **)local_48;
  goto LAB_001bfd97;
LAB_001bfa0c:
  pcVar7 = "cmp(*from1, *from3) <= 0";
  goto LAB_001bf008;
LAB_001bf994:
  local_68 = ppuVar3;
  local_70 = (uchar **)((long)local_70 + lVar8 + 8);
  n2 = (size_t)local_68;
  ppuVar3 = (uchar **)local_48;
  goto LAB_001bfd97;
LAB_001bfb49:
  pcVar7 = "cmp(*from0, *from2) <= 0";
  goto LAB_001bfb59;
LAB_001bf97e:
  local_70 = (uchar **)((long)local_70 + lVar8 + 8);
  n2 = local_38;
  from2 = local_50;
  local_60 = ppuVar3;
  ppuVar3 = local_68;
  goto LAB_001bfd97;
LAB_001bf772:
  pcVar7 = "cmp(*from1, *from0) <= 0";
  goto LAB_001bf78b;
LAB_001bf020:
  pcVar7 = "cmp(*from1, *from3) <= 0";
LAB_001beff0:
  __assert_fail(pcVar7,
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                ,0x1ae,
                "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
               );
LAB_001bf761:
  local_70 = (uchar **)((long)local_70 + lVar8 + 8);
  ppuVar3 = (uchar **)local_48;
LAB_001bfd97:
  merge_3way(local_58,local_40,from2,n2,local_60,(size_t)ppuVar3,local_70);
  return;
LAB_001bf7b0:
  pcVar7 = "cmp(*from3, *from0) <= 0";
LAB_001bf008:
  __assert_fail(pcVar7,
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                ,0x1b1,
                "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
               );
LAB_001beb30:
  pcVar7 = "cmp(*from0, *from3) <= 0";
LAB_001bf4e0:
  __assert_fail(pcVar7,
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                ,0x1b2,
                "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
               );
LAB_001bfe45:
  pcVar7 = "cmp(*from2, *from3) <= 0";
LAB_001bfb71:
  __assert_fail(pcVar7,
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                ,0x1b3,
                "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
               );
LAB_001bf510:
  pcVar7 = "cmp(*from0, *from3) <= 0";
LAB_001bf4f8:
  __assert_fail(pcVar7,
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                ,0x1af,
                "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
               );
LAB_001bfe39:
  pcVar7 = "cmp(*from2, *from0) <= 0";
LAB_001bf64b:
  __assert_fail(pcVar7,
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                ,0x1b5,
                "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
               );
LAB_001bea0d:
  pcVar7 = "cmp(*from0, *from3) <= 0";
LAB_001bf78b:
  __assert_fail(pcVar7,
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                ,0x1b0,
                "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
               );
}

Assistant:

static void
merge_4way(unsigned char** restrict from0, size_t n0,
           unsigned char** restrict from1, size_t n1,
           unsigned char** restrict from2, size_t n2,
           unsigned char** restrict from3, size_t n3,
           unsigned char** restrict result)
{
	debug()<<__func__<<"(), n0="<<n0<<", n1="<<n1<<", n2="<<n2
	       <<", n3="<<n3<<"\n";
	if (cmp(*from0, *from1) <= 0) {
		if (cmp(*from1, *from2) <= 0) {
			/* 0 <= 1 <= 2 */
			if (cmp(*from3, *from0) < 0) goto state_3012;
			if (cmp(*from3, *from1) < 0) goto state_0312;
			if (cmp(*from3, *from2) < 0) goto state_0132;
			goto state_0123;
		}
		if (cmp(*from2, *from0) < 0) {
			/* 2 < 0 <= 1 */
			if (cmp(*from3, *from2) < 0) goto state_3201;
			if (cmp(*from3, *from0) < 0) goto state_2301;
			if (cmp(*from3, *from1) < 0) goto state_2031;
			goto state_2013;
		}
		/* 0 <= 2 < 1 */
		if (cmp(*from3, *from0) < 0) goto state_3021;
		if (cmp(*from3, *from2) < 0) goto state_0321;
		if (cmp(*from3, *from1) < 0) goto state_0231;
		goto state_0213;
	}
	if (cmp(*from1, *from2) <= 0) {
		if (cmp(*from0, *from2) <= 0) {
			/* 1 < 0 <= 2 */
			if (cmp(*from3, *from1) < 0) goto state_3102;
			if (cmp(*from3, *from0) < 0) goto state_1302;
			if (cmp(*from3, *from2) < 0) goto state_1032;
			goto state_1023;
		}
		/* 1 <= 2 < 0 */
		if (cmp(*from3, *from1) < 0) goto state_3120;
		if (cmp(*from3, *from2) < 0) goto state_1320;
		if (cmp(*from3, *from0) < 0) goto state_1230;
		goto state_1203;
	}
	/* 2 < 1 < 0 */
	if (cmp(*from3, *from2) < 0) goto state_3210;
	if (cmp(*from3, *from1) < 0) goto state_2310;
	if (cmp(*from3, *from0) < 0) goto state_2130;
	goto state_2103;

#define MAKE_STATE(a,b,c,d)                                                    \
        state_ ## a ## b ## c ## d:                                            \
        assert(cmp(*from ## a, *from ## b) <= 0);                              \
        assert(cmp(*from ## b, *from ## c) <= 0);                              \
        assert(cmp(*from ## c, *from ## d) <= 0);                              \
        *result++ = *from ## a ++;                                             \
        if (--n ## a == 0) goto finish ## a ;                                  \
        if (a < b) if (cmp(*from##a, *from##b) <= 0) goto state_##a##b##c##d;  \
        if (a > b) if (cmp(*from##a, *from##b) <  0) goto state_##a##b##c##d;  \
        if (a < c) if (cmp(*from##a, *from##c) <= 0) goto state_##b##a##c##d;  \
        if (a > c) if (cmp(*from##a, *from##c) <  0) goto state_##b##a##c##d;  \
        if (a < d) if (cmp(*from##a, *from##d) <= 0) goto state_##b##c##a##d;  \
        if (a > d) if (cmp(*from##a, *from##d) <  0) goto state_##b##c##a##d;  \
        goto state_ ## b ## c ## d ## a;

	MAKE_STATE(0, 1, 2, 3); MAKE_STATE(0, 1, 3, 2); MAKE_STATE(0, 2, 1, 3);
	MAKE_STATE(0, 2, 3, 1); MAKE_STATE(0, 3, 1, 2); MAKE_STATE(0, 3, 2, 1);
	MAKE_STATE(1, 0, 2, 3); MAKE_STATE(1, 0, 3, 2); MAKE_STATE(1, 2, 0, 3);
	MAKE_STATE(1, 2, 3, 0); MAKE_STATE(1, 3, 0, 2); MAKE_STATE(1, 3, 2, 0);
	MAKE_STATE(2, 0, 1, 3); MAKE_STATE(2, 0, 3, 1); MAKE_STATE(2, 1, 0, 3);
	MAKE_STATE(2, 1, 3, 0); MAKE_STATE(2, 3, 0, 1); MAKE_STATE(2, 3, 1, 0);
	MAKE_STATE(3, 0, 1, 2); MAKE_STATE(3, 0, 2, 1); MAKE_STATE(3, 1, 0, 2);
	MAKE_STATE(3, 1, 2, 0); MAKE_STATE(3, 2, 0, 1); MAKE_STATE(3, 2, 1, 0);
#undef MAKE_STATE

finish0:
	assert(n0 == 0);
	merge_3way(from1, n1, from2, n2, from3, n3, result);
	return;
finish1:
	assert(n1 == 0);
	merge_3way(from0, n0, from2, n2, from3, n3, result);
	return;
finish2:
	assert(n2 == 0);
	merge_3way(from0, n0, from1, n1, from3, n3, result);
	return;
finish3:
	assert(n3 == 0);
	merge_3way(from0, n0, from1, n1, from2, n2, result);
	return;
}